

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::iterationAnalysisMajor(HEkkDual *this)

{
  bool bVar1;
  HEkkDual *in_RDI;
  bool switch_to_devex;
  HEkk *in_stack_00000040;
  
  iterationAnalysisMajorData(in_RDI);
  if ((in_RDI->edge_weight_mode == kSteepestEdge) &&
     (bVar1 = HEkk::switchToDevex(in_stack_00000040), bVar1)) {
    in_RDI->edge_weight_mode = kDevex;
    initialiseDevexFramework(this);
  }
  if ((in_RDI->analysis->analyse_simplex_summary_data & 1U) != 0) {
    HighsSimplexAnalysis::iterationRecord((HighsSimplexAnalysis *)this);
    HighsSimplexAnalysis::iterationRecordMajor(in_RDI->analysis);
  }
  return;
}

Assistant:

void HEkkDual::iterationAnalysisMajor() {
  iterationAnalysisMajorData();
  // Possibly switch from DSE to Devex
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    bool switch_to_devex = false;
    //    switch_to_devex = analysis->switchToDevex();
    switch_to_devex = ekk_instance_.switchToDevex();
    if (switch_to_devex) {
      edge_weight_mode = EdgeWeightMode::kDevex;
      // Set up the Devex framework
      initialiseDevexFramework();
    }
  }
  if (analysis->analyse_simplex_summary_data) {
    analysis->iterationRecord();
    analysis->iterationRecordMajor();
  }
}